

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_draw_cylinder_wires
               (rf_vec3 position,float radius_top,float radius_bottom,float height,int sides,
               rf_color color)

{
  _Bool _Var1;
  float fVar2;
  float fVar3;
  undefined8 local_48;
  rf_int i;
  undefined4 local_38;
  int num_vertex;
  int sides_local;
  float height_local;
  float radius_bottom_local;
  float radius_top_local;
  rf_color color_local;
  undefined4 local_14;
  undefined4 uStack_10;
  rf_vec3 position_local;
  
  local_38 = sides;
  if (sides < 3) {
    local_38 = 3;
  }
  _Var1 = rf_gfx_check_buffer_limit(local_38 << 3);
  if (_Var1) {
    rf_gfx_draw();
  }
  rf_gfx_push_matrix();
  local_14 = position.x;
  uStack_10 = position.y;
  rf_gfx_translatef(local_14,uStack_10,position.z);
  rf_gfx_begin(RF_LINES);
  radius_bottom_local._0_1_ = color.r;
  radius_bottom_local._1_1_ = color.g;
  radius_bottom_local._2_1_ = color.b;
  radius_bottom_local._3_1_ = color.a;
  rf_gfx_color4ub(radius_bottom_local._0_1_,radius_bottom_local._1_1_,radius_bottom_local._2_1_,
                  radius_bottom_local._3_1_);
  for (local_48 = 0; local_48 < 0x168; local_48 = (int)(0x168 / (long)local_38) + local_48) {
    fVar2 = sinf((float)local_48 * 0.017453292);
    fVar3 = cosf((float)local_48 * 0.017453292);
    rf_gfx_vertex3f(fVar2 * radius_bottom,0.0,fVar3 * radius_bottom);
    fVar2 = sinf((float)(local_48 + (int)(0x168 / (long)local_38)) * 0.017453292);
    fVar3 = cosf((float)(local_48 + (int)(0x168 / (long)local_38)) * 0.017453292);
    rf_gfx_vertex3f(fVar2 * radius_bottom,0.0,fVar3 * radius_bottom);
    fVar2 = sinf((float)(local_48 + (int)(0x168 / (long)local_38)) * 0.017453292);
    fVar3 = cosf((float)(local_48 + (int)(0x168 / (long)local_38)) * 0.017453292);
    rf_gfx_vertex3f(fVar2 * radius_bottom,0.0,fVar3 * radius_bottom);
    fVar2 = sinf((float)(local_48 + (int)(0x168 / (long)local_38)) * 0.017453292);
    fVar3 = cosf((float)(local_48 + (int)(0x168 / (long)local_38)) * 0.017453292);
    rf_gfx_vertex3f(fVar2 * radius_top,height,fVar3 * radius_top);
    fVar2 = sinf((float)(local_48 + (int)(0x168 / (long)local_38)) * 0.017453292);
    fVar3 = cosf((float)(local_48 + (int)(0x168 / (long)local_38)) * 0.017453292);
    rf_gfx_vertex3f(fVar2 * radius_top,height,fVar3 * radius_top);
    fVar2 = sinf((float)local_48 * 0.017453292);
    fVar3 = cosf((float)local_48 * 0.017453292);
    rf_gfx_vertex3f(fVar2 * radius_top,height,fVar3 * radius_top);
    fVar2 = sinf((float)local_48 * 0.017453292);
    fVar3 = cosf((float)local_48 * 0.017453292);
    rf_gfx_vertex3f(fVar2 * radius_top,height,fVar3 * radius_top);
    fVar2 = sinf((float)local_48 * 0.017453292);
    fVar3 = cosf((float)local_48 * 0.017453292);
    rf_gfx_vertex3f(fVar2 * radius_bottom,0.0,fVar3 * radius_bottom);
  }
  rf_gfx_end();
  rf_gfx_pop_matrix();
  return;
}

Assistant:

RF_API void rf_draw_cylinder_wires(rf_vec3 position, float radius_top, float radius_bottom, float height, int sides, rf_color color)
{
    if (sides < 3) sides = 3;

    int num_vertex = sides*8;
    if (rf_gfx_check_buffer_limit(num_vertex)) rf_gfx_draw();

    rf_gfx_push_matrix();
    rf_gfx_translatef(position.x, position.y, position.z);

    rf_gfx_begin(RF_LINES);
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);

    for (rf_int i = 0; i < 360; i += 360/sides)
    {
        rf_gfx_vertex3f(sinf(RF_DEG2RAD*i)*radius_bottom, 0, cosf(RF_DEG2RAD*i)*radius_bottom);
        rf_gfx_vertex3f(sinf(RF_DEG2RAD*(i + 360/sides))*radius_bottom, 0, cosf(RF_DEG2RAD*(i + 360/sides))*radius_bottom);

        rf_gfx_vertex3f(sinf(RF_DEG2RAD*(i + 360/sides))*radius_bottom, 0, cosf(RF_DEG2RAD*(i + 360/sides))*radius_bottom);
        rf_gfx_vertex3f(sinf(RF_DEG2RAD*(i + 360/sides))*radius_top, height, cosf(RF_DEG2RAD*(i + 360/sides))*radius_top);

        rf_gfx_vertex3f(sinf(RF_DEG2RAD*(i + 360/sides))*radius_top, height, cosf(RF_DEG2RAD*(i + 360/sides))*radius_top);
        rf_gfx_vertex3f(sinf(RF_DEG2RAD*i)*radius_top, height, cosf(RF_DEG2RAD*i)*radius_top);

        rf_gfx_vertex3f(sinf(RF_DEG2RAD*i)*radius_top, height, cosf(RF_DEG2RAD*i)*radius_top);
        rf_gfx_vertex3f(sinf(RF_DEG2RAD*i)*radius_bottom, 0, cosf(RF_DEG2RAD*i)*radius_bottom);
    }
    rf_gfx_end();
    rf_gfx_pop_matrix();
}